

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap_blitter.cpp
# Opt level: O0

QBlittable * __thiscall QBlittablePlatformPixmap::blittable(QBlittablePlatformPixmap *this)

{
  bool bVar1;
  QBlittable *pQVar2;
  QBlittable *in_RDI;
  long in_FS_OFFSET;
  QBlittablePlatformPixmap *that;
  undefined8 in_stack_ffffffffffffffc8;
  QBlittablePrivate **this_00;
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QScopedPointer<QBlittable,_QScopedPointerDeleter<QBlittable>_>::operator!
                    ((QScopedPointer<QBlittable,_QScopedPointerDeleter<QBlittable>_> *)
                     &in_RDI[3].d_ptr);
  if (bVar1) {
    this_00 = &in_RDI[3].d_ptr;
    QSize::QSize((QSize *)this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                 (int)in_stack_ffffffffffffffc8);
    (*in_RDI->_vptr_QBlittable[0x17])
              (in_RDI,local_10,(ulong)*(byte *)&in_RDI[4]._vptr_QBlittable & 1);
    QScopedPointer<QBlittable,_QScopedPointerDeleter<QBlittable>_>::reset
              ((QScopedPointer<QBlittable,_QScopedPointerDeleter<QBlittable>_> *)this_00,in_RDI);
  }
  pQVar2 = QScopedPointer<QBlittable,_QScopedPointerDeleter<QBlittable>_>::data
                     ((QScopedPointer<QBlittable,_QScopedPointerDeleter<QBlittable>_> *)
                      &in_RDI[3].d_ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QBlittable *QBlittablePlatformPixmap::blittable() const
{
    if (!m_blittable) {
        QBlittablePlatformPixmap *that = const_cast<QBlittablePlatformPixmap *>(this);
        that->m_blittable.reset(this->createBlittable(QSize(w, h), m_alpha));
    }

    return m_blittable.data();
}